

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsharedmemory_posix.cpp
# Opt level: O0

bool QSharedMemoryPosix::runtimeSupportCheck(void)

{
  long lVar1;
  int iVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (runtimeSupportCheck()::result == '\0') {
    iVar2 = __cxa_guard_acquire(&runtimeSupportCheck()::result);
    if (iVar2 != 0) {
      runtimeSupportCheck::result =
           runtimeSupportCheck::anon_class_1_0_00000001::operator()
                     ((anon_class_1_0_00000001 *)0x8d281a);
      __cxa_guard_release(&runtimeSupportCheck()::result);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)(runtimeSupportCheck::result & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool QSharedMemoryPosix::runtimeSupportCheck()
{
    static const bool result = []() {
        (void)shm_open("", 0, 0);         // this WILL fail
        return errno != ENOSYS;
    }();
    return result;
}